

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeLiteGenerator.cxx
# Opt level: O2

string * __thiscall
cmExtraCodeLiteGenerator::GetConfigurationName_abi_cxx11_
          (string *__return_storage_ptr__,cmExtraCodeLiteGenerator *this,cmMakefile *mf)

{
  string *psVar1;
  long lVar2;
  allocator<char> local_31;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"CMAKE_BUILD_TYPE",&local_31);
  psVar1 = cmMakefile::GetSafeDefinition(mf,&local_30);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar1);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::find_first_not_of((char *)__return_storage_ptr__,0x6a1662);
  std::__cxx11::string::erase((ulong)__return_storage_ptr__,0);
  lVar2 = std::__cxx11::string::find_last_not_of((char *)__return_storage_ptr__,0x6a1662);
  std::__cxx11::string::erase((ulong)__return_storage_ptr__,lVar2 + 1);
  if (__return_storage_ptr__->_M_string_length == 0) {
    std::__cxx11::string::assign((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmExtraCodeLiteGenerator::GetConfigurationName(
  const cmMakefile* mf) const
{
  std::string confName = mf->GetSafeDefinition("CMAKE_BUILD_TYPE");
  // Trim the configuration name from whitespaces (left and right)
  confName.erase(0, confName.find_first_not_of(" \t\r\v\n"));
  confName.erase(confName.find_last_not_of(" \t\r\v\n") + 1);
  if (confName.empty()) {
    confName = "NoConfig";
  }
  return confName;
}